

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headerssync.cpp
# Opt level: O3

bool __thiscall
HeadersSyncState::ValidateAndStoreHeadersCommitments
          (HeadersSyncState *this,vector<CBlockHeader,_std::allocator<CBlockHeader>_> *headers)

{
  pointer pCVar1;
  CBlockIndex *pCVar2;
  uint256 *puVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  Logger *pLVar10;
  int i;
  long lVar11;
  CBlockHeader *hdr;
  pointer pCVar12;
  long in_FS_OFFSET;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  uint256 local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar12 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
            super__Vector_impl_data._M_start;
  bVar7 = true;
  if ((headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
      super__Vector_impl_data._M_finish == pCVar12) goto LAB_00869062;
  if (this->m_download_state == PRESYNC) {
    CBlockHeader::GetHash(&local_50,&this->m_last_header_received);
    auVar14[0] = -(local_50.super_base_blob<256U>.m_data._M_elems[0] ==
                  (pCVar12->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0]);
    auVar14[1] = -(local_50.super_base_blob<256U>.m_data._M_elems[1] ==
                  (pCVar12->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[1]);
    auVar14[2] = -(local_50.super_base_blob<256U>.m_data._M_elems[2] ==
                  (pCVar12->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[2]);
    auVar14[3] = -(local_50.super_base_blob<256U>.m_data._M_elems[3] ==
                  (pCVar12->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[3]);
    auVar14[4] = -(local_50.super_base_blob<256U>.m_data._M_elems[4] ==
                  (pCVar12->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[4]);
    auVar14[5] = -(local_50.super_base_blob<256U>.m_data._M_elems[5] ==
                  (pCVar12->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[5]);
    auVar14[6] = -(local_50.super_base_blob<256U>.m_data._M_elems[6] ==
                  (pCVar12->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[6]);
    auVar14[7] = -(local_50.super_base_blob<256U>.m_data._M_elems[7] ==
                  (pCVar12->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[7]);
    auVar14[8] = -(local_50.super_base_blob<256U>.m_data._M_elems[8] ==
                  (pCVar12->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[8]);
    auVar14[9] = -(local_50.super_base_blob<256U>.m_data._M_elems[9] ==
                  (pCVar12->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[9]);
    auVar14[10] = -(local_50.super_base_blob<256U>.m_data._M_elems[10] ==
                   (pCVar12->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[10]);
    auVar14[0xb] = -(local_50.super_base_blob<256U>.m_data._M_elems[0xb] ==
                    (pCVar12->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0xb]);
    auVar14[0xc] = -(local_50.super_base_blob<256U>.m_data._M_elems[0xc] ==
                    (pCVar12->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0xc]);
    auVar14[0xd] = -(local_50.super_base_blob<256U>.m_data._M_elems[0xd] ==
                    (pCVar12->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0xd]);
    auVar14[0xe] = -(local_50.super_base_blob<256U>.m_data._M_elems[0xe] ==
                    (pCVar12->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0xe]);
    auVar14[0xf] = -(local_50.super_base_blob<256U>.m_data._M_elems[0xf] ==
                    (pCVar12->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0xf]);
    auVar13[0] = -(local_50.super_base_blob<256U>.m_data._M_elems[0x10] ==
                  (pCVar12->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x10]);
    auVar13[1] = -(local_50.super_base_blob<256U>.m_data._M_elems[0x11] ==
                  (pCVar12->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x11]);
    auVar13[2] = -(local_50.super_base_blob<256U>.m_data._M_elems[0x12] ==
                  (pCVar12->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x12]);
    auVar13[3] = -(local_50.super_base_blob<256U>.m_data._M_elems[0x13] ==
                  (pCVar12->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x13]);
    auVar13[4] = -(local_50.super_base_blob<256U>.m_data._M_elems[0x14] ==
                  (pCVar12->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x14]);
    auVar13[5] = -(local_50.super_base_blob<256U>.m_data._M_elems[0x15] ==
                  (pCVar12->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x15]);
    auVar13[6] = -(local_50.super_base_blob<256U>.m_data._M_elems[0x16] ==
                  (pCVar12->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x16]);
    auVar13[7] = -(local_50.super_base_blob<256U>.m_data._M_elems[0x17] ==
                  (pCVar12->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x17]);
    auVar13[8] = -(local_50.super_base_blob<256U>.m_data._M_elems[0x18] ==
                  (pCVar12->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x18]);
    auVar13[9] = -(local_50.super_base_blob<256U>.m_data._M_elems[0x19] ==
                  (pCVar12->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x19]);
    auVar13[10] = -(local_50.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                   (pCVar12->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x1a]);
    auVar13[0xb] = -(local_50.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                    (pCVar12->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x1b]);
    auVar13[0xc] = -(local_50.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                    (pCVar12->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x1c]);
    auVar13[0xd] = -(local_50.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                    (pCVar12->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x1d]);
    auVar13[0xe] = -(local_50.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                    (pCVar12->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x1e]);
    auVar13[0xf] = -(local_50.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                    (pCVar12->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x1f]);
    auVar13 = auVar13 & auVar14;
    if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) == 0xffff) {
      pCVar1 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (pCVar12 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>).
                     _M_impl.super__Vector_impl_data._M_start; pCVar12 != pCVar1;
          pCVar12 = pCVar12 + 1) {
        bVar8 = ValidateAndProcessSingleHeader(this,pCVar12);
        if (!bVar8) goto LAB_00869060;
      }
      iVar9 = base_uint<256U>::CompareTo
                        (&(this->m_current_chain_work).super_base_uint<256U>,
                         &(this->m_minimum_required_work).super_base_uint<256U>);
      if (-1 < iVar9) {
        std::deque<CompressedHeader,_std::allocator<CompressedHeader>_>::clear
                  (&this->m_redownloaded_headers);
        pCVar2 = this->m_chain_start;
        this->m_redownload_buffer_last_height = (long)pCVar2->nHeight;
        puVar3 = pCVar2->phashBlock;
        if (puVar3 != (uint256 *)0x0) {
          uVar4 = *(undefined8 *)(puVar3->super_base_blob<256U>).m_data._M_elems;
          uVar5 = *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 8);
          uVar6 = *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x18);
          *(undefined8 *)
           ((this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems + 0x10
           ) = *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x10);
          *(undefined8 *)
           ((this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems + 0x18
           ) = uVar6;
          *(undefined8 *)
           (this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems = uVar4
          ;
          *(undefined8 *)
           ((this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems + 8) =
               uVar5;
          puVar3 = pCVar2->phashBlock;
          if (puVar3 != (uint256 *)0x0) {
            uVar4 = *(undefined8 *)(puVar3->super_base_blob<256U>).m_data._M_elems;
            uVar5 = *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 8);
            uVar6 = *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x18);
            *(undefined8 *)
             ((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems + 0x10) =
                 *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x10);
            *(undefined8 *)
             ((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems + 0x18) =
                 uVar6;
            *(undefined8 *)
             (this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems = uVar4;
            *(undefined8 *)
             ((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems + 8) =
                 uVar5;
            if (&this->m_redownload_chain_work != &pCVar2->nChainWork) {
              lVar11 = 0;
              do {
                (this->m_redownload_chain_work).super_base_uint<256U>.pn[lVar11] =
                     (pCVar2->nChainWork).super_base_uint<256U>.pn[lVar11];
                lVar11 = lVar11 + 1;
              } while (lVar11 != 8);
            }
            this->m_download_state = REDOWNLOAD;
            pLVar10 = LogInstance();
            bVar8 = BCLog::Logger::WillLogCategoryLevel(pLVar10,NET,Debug);
            if (bVar8) {
              source_file_00._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/headerssync.cpp"
              ;
              source_file_00._M_len = 0x5f;
              logging_function_00._M_str = "ValidateAndStoreHeadersCommitments";
              logging_function_00._M_len = 0x22;
              LogPrintFormatInternal<long,long,long>
                        (logging_function_00,source_file_00,0xad,NET,Debug,
                         (ConstevalFormatString<3U>)0xf6eb05,&this->m_id,&this->m_current_height,
                         &this->m_redownload_buffer_last_height);
            }
            goto LAB_00869062;
          }
        }
        __assert_fail("phashBlock != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                      ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
      }
      goto LAB_00869062;
    }
    pLVar10 = LogInstance();
    bVar7 = BCLog::Logger::WillLogCategoryLevel(pLVar10,NET,Debug);
    if (bVar7) {
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/headerssync.cpp"
      ;
      source_file._M_len = 0x5f;
      logging_function._M_str = "ValidateAndStoreHeadersCommitments";
      logging_function._M_len = 0x22;
      LogPrintFormatInternal<long,long>
                (logging_function,source_file,0x9a,NET,Debug,(ConstevalFormatString<2U>)0xf6eaa5,
                 &this->m_id,&this->m_current_height);
    }
  }
LAB_00869060:
  bVar7 = false;
LAB_00869062:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool HeadersSyncState::ValidateAndStoreHeadersCommitments(const std::vector<CBlockHeader>& headers)
{
    // The caller should not give us an empty set of headers.
    Assume(headers.size() > 0);
    if (headers.size() == 0) return true;

    Assume(m_download_state == State::PRESYNC);
    if (m_download_state != State::PRESYNC) return false;

    if (headers[0].hashPrevBlock != m_last_header_received.GetHash()) {
        // Somehow our peer gave us a header that doesn't connect.
        // This might be benign -- perhaps our peer reorged away from the chain
        // they were on. Give up on this sync for now (likely we will start a
        // new sync with a new starting point).
        LogDebug(BCLog::NET, "Initial headers sync aborted with peer=%d: non-continuous headers at height=%i (presync phase)\n", m_id, m_current_height);
        return false;
    }

    // If it does connect, (minimally) validate and occasionally store
    // commitments.
    for (const auto& hdr : headers) {
        if (!ValidateAndProcessSingleHeader(hdr)) {
            return false;
        }
    }

    if (m_current_chain_work >= m_minimum_required_work) {
        m_redownloaded_headers.clear();
        m_redownload_buffer_last_height = m_chain_start->nHeight;
        m_redownload_buffer_first_prev_hash = m_chain_start->GetBlockHash();
        m_redownload_buffer_last_hash = m_chain_start->GetBlockHash();
        m_redownload_chain_work = m_chain_start->nChainWork;
        m_download_state = State::REDOWNLOAD;
        LogDebug(BCLog::NET, "Initial headers sync transition with peer=%d: reached sufficient work at height=%i, redownloading from height=%i\n", m_id, m_current_height, m_redownload_buffer_last_height);
    }
    return true;
}